

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int event_changelist_grow(event_changelist *changelist)

{
  event_change *peVar1;
  event_change *new_changes;
  int new_size;
  event_changelist *changelist_local;
  
  if (changelist->changes_size < 0x40) {
    new_changes._4_4_ = 0x40;
  }
  else {
    new_changes._4_4_ = changelist->changes_size << 1;
  }
  peVar1 = (event_change *)event_mm_realloc_(changelist->changes,(long)new_changes._4_4_ * 0xc);
  if (peVar1 == (event_change *)0x0) {
    changelist_local._4_4_ = -1;
  }
  else {
    changelist->changes = peVar1;
    changelist->changes_size = new_changes._4_4_;
    changelist_local._4_4_ = 0;
  }
  return changelist_local._4_4_;
}

Assistant:

static int
event_changelist_grow(struct event_changelist *changelist)
{
	int new_size;
	struct event_change *new_changes;
	if (changelist->changes_size < 64)
		new_size = 64;
	else
		new_size = changelist->changes_size * 2;

	new_changes = mm_realloc(changelist->changes,
	    new_size * sizeof(struct event_change));

	if (EVUTIL_UNLIKELY(new_changes == NULL))
		return (-1);

	changelist->changes = new_changes;
	changelist->changes_size = new_size;

	return (0);
}